

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPL3.cpp
# Opt level: O1

void __thiscall OPL3::SetPanning(OPL3 *this,int c,float left,float right)

{
  Channel *pCVar1;
  Channel **ppCVar2;
  
  if (this->FullPan == true) {
    ppCVar2 = (Channel **)((this->disabledChannel).super_Channel.feedback + ((ulong)(c - 9) - 10));
    if (c < 9) {
      ppCVar2 = this->channels[0] + c;
    }
    pCVar1 = *ppCVar2;
    pCVar1->leftPan = (double)left;
    pCVar1->rightPan = (double)right;
  }
  return;
}

Assistant:

void OPL3::SetPanning(int c, float left, float right)
{
	if (FullPan)
	{
		Channel *channel;

		if (c < 9)
		{
			channel = channels[0][c];
		}
		else
		{
			channel = channels[1][c - 9];
		}
		channel->leftPan = left;
		channel->rightPan = right;
	}
}